

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O2

void __thiscall
xercesc_4_0::CMStateSet::CMStateSet(CMStateSet *this,XMLSize_t bitCount,MemoryManager *manager)

{
  int iVar1;
  XMLSize_t index;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  long lVar4;
  XMLSize_t XVar5;
  CMDynamicBuffer *pCVar2;
  
  this->fBitCount = bitCount;
  this->fDynamicBuffer = (CMDynamicBuffer *)0x0;
  if (bitCount < 0x81) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      this->fBits[lVar4] = 0;
    }
  }
  else {
    iVar1 = (*manager->_vptr_MemoryManager[3])(manager,0x18);
    pCVar2 = (CMDynamicBuffer *)CONCAT44(extraout_var,iVar1);
    this->fDynamicBuffer = pCVar2;
    pCVar2->fMemoryManager = manager;
    XVar5 = ((this->fBitCount >> 10) + 1) - (ulong)((this->fBitCount & 0x3ff) == 0);
    pCVar2->fArraySize = XVar5;
    iVar1 = (*manager->_vptr_MemoryManager[3])(manager,XVar5 * 8);
    pCVar2 = this->fDynamicBuffer;
    pCVar2->fBitArray = (XMLInt32 **)CONCAT44(extraout_var_00,iVar1);
    for (uVar3 = 0; uVar3 < pCVar2->fArraySize; uVar3 = uVar3 + 1) {
      pCVar2->fBitArray[uVar3] = (XMLInt32 *)0x0;
      pCVar2 = this->fDynamicBuffer;
    }
  }
  return;
}

Assistant:

CMStateSet( const XMLSize_t bitCount
              , MemoryManager* const manager = XMLPlatformUtils::fgMemoryManager) :

        fBitCount(bitCount)
        , fDynamicBuffer(0)
    {
        //
        //  See if we need to allocate the byte array or whether we can live
        //  within the cached bit high performance scheme.
        //
        if (fBitCount > (CMSTATE_CACHED_INT32_SIZE * 32))
        {
            fDynamicBuffer = (CMDynamicBuffer*)manager->allocate(sizeof(CMDynamicBuffer));
            fDynamicBuffer->fMemoryManager = manager;
            // allocate an array of vectors, each one containing CMSTATE_BITFIELD_CHUNK bits
            fDynamicBuffer->fArraySize = fBitCount / CMSTATE_BITFIELD_CHUNK;
            if (fBitCount % CMSTATE_BITFIELD_CHUNK)
                fDynamicBuffer->fArraySize++;
            try
            {
                fDynamicBuffer->fBitArray = (XMLInt32**) fDynamicBuffer->fMemoryManager->allocate(fDynamicBuffer->fArraySize*sizeof(XMLInt32*));
            }
            catch( const OutOfMemoryException& )
            {
                fDynamicBuffer->fMemoryManager->deallocate(fDynamicBuffer);
                throw;
            }
            for(XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
                fDynamicBuffer->fBitArray[index]=NULL;
        }
        else
        {
            for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
                fBits[index] = 0;
        }
    }